

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_set_wrong_format(void)

{
  archive *filename;
  int unaff_retaddr;
  archive *in_stack_00000008;
  archive *a;
  archive_entry *ae;
  char reffile [25];
  char *in_stack_000003d0;
  archive_entry **in_stack_ffffffffffffffb8;
  archive *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  char *file;
  wchar_t code;
  archive *_a;
  undefined1 uVar1;
  undefined7 in_stack_fffffffffffffff1;
  
  file = (char *)0x6165725f74736574;
  code = L'\x74616d72';
  _a = (archive *)0x70697a2e70697a5f;
  uVar1 = 0;
  extract_reference_file(in_stack_000003d0);
  filename = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)filename >> 0x20),(wchar_t)filename,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  archive_read_set_format(_a,code);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)filename >> 0x20),(wchar_t)filename,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  archive_read_append_filter(in_stack_00000008,unaff_retaddr);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)filename >> 0x20),(wchar_t)filename,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)filename,(size_t)in_stack_ffffffffffffffc0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)filename >> 0x20),(wchar_t)filename,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  archive_read_next_header(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)filename >> 0x20),(wchar_t)filename,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  archive_read_close((archive *)0x1c7720);
  assertion_equal_int(file,in_stack_ffffffffffffffd4,(longlong)filename,
                      (char *)in_stack_ffffffffffffffc0,(longlong)filename,(char *)0x1c774f,
                      (void *)CONCAT71(in_stack_fffffffffffffff1,uVar1));
  archive_read_free((archive *)0x1c7759);
  assertion_equal_int(file,in_stack_ffffffffffffffd4,(longlong)filename,
                      (char *)in_stack_ffffffffffffffc0,0,(char *)0x1c7787,
                      (void *)CONCAT71(in_stack_fffffffffffffff1,uVar1));
  return;
}

Assistant:

DEFINE_TEST(test_read_set_wrong_format)
{
  const char reffile[] = "test_read_format_zip.zip";
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR));
  assertA(0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* Check that this actually fails, then close the archive. */
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}